

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Fts3Cursor *unaff_retaddr;
  Fts3Cursor *in_stack_00000010;
  int bMiss;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_fffffffffffffff0;
  Fts3Expr *pExpr;
  
  pExpr = *(Fts3Expr **)(in_FS_OFFSET + 0x28);
  iVar1 = *in_RSI;
  uVar4 = 0;
  if (iVar1 == 0) {
    if ((*(long *)(in_RDI + 0x28) != 0) &&
       (iVar1 = fts3CursorSeek((sqlite3_context *)(ulong)in_stack_ffffffffffffffd8,
                               (Fts3Cursor *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
       iVar1 == 0)) {
      iVar1 = sqlite3Fts3CacheDeferredDoclists(in_stack_00000010);
    }
    iVar2 = fts3EvalTestExpr(unaff_retaddr,pExpr,(int *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    uVar4 = (uint)(iVar2 == 0);
    sqlite3Fts3FreeDeferredDoclists
              ((Fts3Cursor *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    *in_RSI = iVar1;
  }
  uVar3 = 0;
  if (iVar1 == 0) {
    uVar3 = (uint)(uVar4 != 0) << 0x18;
  }
  if (*(Fts3Expr **)(in_FS_OFFSET + 0x28) != pExpr) {
    __stack_chk_fail();
  }
  return uVar3 >> 0x18;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()).
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}